

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 SyUriDecode(char *zSrc,sxu32 nLen,ProcConsumer xConsumer,void *pUserData,int bUTF8)

{
  byte bVar1;
  uint in_EAX;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  byte *pbVar6;
  byte *pbVar7;
  bool bVar8;
  sxu8 zOut [10];
  byte local_3a;
  byte local_39;
  byte local_38;
  byte local_37;
  undefined1 local_36 [6];
  
  pbVar7 = (byte *)(zSrc + nLen);
  do {
    bVar8 = pbVar7 <= zSrc;
    pbVar6 = (byte *)zSrc;
    if (!bVar8) {
      do {
        bVar1 = *pbVar6;
        in_EAX = (uint)bVar1;
        if ((bVar1 == 0x25) || (bVar1 == 0x2b)) break;
        pbVar6 = pbVar6 + 1;
        bVar8 = pbVar6 >= pbVar7;
      } while (pbVar6 < pbVar7);
    }
    if (pbVar6 != (byte *)zSrc) {
      iVar2 = (*xConsumer)(zSrc,(int)pbVar6 - (int)zSrc,pUserData);
      in_EAX = CONCAT31((int3)((uint)iVar2 >> 8),iVar2 != 0);
      bVar8 = (bool)(bVar8 | iVar2 != 0);
    }
    if (bVar8) {
      return in_EAX;
    }
    if (*pbVar6 == 0x2b) {
      local_3a = 0x20;
      zSrc = (char *)(pbVar6 + 1);
LAB_0012353b:
      iVar2 = (int)&local_39;
    }
    else {
      if (pbVar7 <= pbVar6 + 2) {
        return in_EAX;
      }
      iVar2 = (int)(char)pbVar6[1];
      if (iVar2 - 0x61U < 6) {
        uVar4 = iVar2 - 0x57;
      }
      else {
        uVar4 = iVar2 - 0x30;
        if ((9 < uVar4) && (uVar4 = iVar2 - 0x37, 5 < iVar2 - 0x41U)) {
          uVar4 = 0;
        }
      }
      iVar2 = (int)(char)pbVar6[2];
      if (iVar2 - 0x61U < 6) {
        uVar3 = iVar2 - 0x57;
      }
      else {
        uVar3 = iVar2 - 0x30;
        if ((9 < uVar3) && (uVar3 = iVar2 - 0x37, 5 < iVar2 - 0x41U)) {
          uVar3 = 0;
        }
      }
      iVar2 = uVar4 * 0x10 + uVar3;
      zSrc = (char *)(pbVar6 + 3);
      if (uVar4 < 0xc) {
        local_3a = (byte)iVar2;
        goto LAB_0012353b;
      }
      uVar4 = (uint)""[iVar2 - 0xc0];
      bVar1 = *zSrc;
      while (bVar1 == 0x25) {
        iVar2 = (int)(char)((byte *)zSrc)[1];
        if (iVar2 - 0x61U < 6) {
          uVar3 = iVar2 - 0x57;
        }
        else {
          uVar3 = iVar2 - 0x30;
          if ((9 < uVar3) && (uVar3 = iVar2 - 0x37, 5 < iVar2 - 0x41U)) {
            uVar3 = 0;
          }
        }
        iVar2 = (int)(char)((byte *)zSrc)[2];
        if (iVar2 - 0x61U < 6) {
          uVar5 = iVar2 - 0x57;
        }
        else {
          uVar5 = iVar2 - 0x30;
          if ((9 < uVar5) && (uVar5 = iVar2 - 0x37, 5 < iVar2 - 0x41U)) {
            uVar5 = 0;
          }
        }
        if ((uVar3 & 0xc) != 8) break;
        uVar4 = uVar4 * 0x40 + ((uVar3 & 3) << 4 | uVar5);
        bVar1 = ((byte *)zSrc)[3];
        zSrc = (char *)((byte *)zSrc + 3);
      }
      bVar1 = (byte)uVar4;
      local_3a = bVar1;
      if ((int)uVar4 < 0x80) goto LAB_0012353b;
      if ((int)uVar4 < 0x800) {
        local_3a = (byte)(uVar4 >> 6) & 0x1f | 0xc0;
        local_39 = bVar1 & 0x3f | 0x80;
        iVar2 = (int)&local_38;
      }
      else if ((int)uVar4 < 0x10000) {
        local_3a = (byte)(uVar4 >> 0xc) & 0xf | 0xe0;
        local_39 = (byte)(uVar4 >> 6) & 0x3f | 0x80;
        local_38 = bVar1 & 0x3f | 0x80;
        iVar2 = (int)&local_37;
      }
      else {
        local_3a = (byte)(uVar4 >> 0x12) & 7 | 0xf0;
        local_39 = (byte)(uVar4 >> 0xc) & 0x3f | 0x80;
        local_38 = (byte)(uVar4 >> 6) & 0x3f | 0x80;
        local_37 = bVar1 & 0x3f | 0x80;
        iVar2 = (int)local_36;
      }
    }
    in_EAX = (*xConsumer)(&local_3a,iVar2 - (int)&local_3a,pUserData);
    if (in_EAX != 0) {
      return in_EAX;
    }
  } while( true );
}

Assistant:

JX9_PRIVATE sxi32 SyUriDecode(const char *zSrc, sxu32 nLen, ProcConsumer xConsumer, void *pUserData, int bUTF8)
{
	static const sxu8 Utf8Trans[] = {
		0x00, 0x01, 0x02, 0x03, 0x04, 0x05, 0x06, 0x07, 
		0x08, 0x09, 0x0a, 0x0b, 0x0c, 0x0d, 0x0e, 0x0f, 
		0x10, 0x11, 0x12, 0x13, 0x14, 0x15, 0x16, 0x17, 
		0x18, 0x19, 0x1a, 0x1b, 0x1c, 0x1d, 0x1e, 0x1f, 
		0x00, 0x01, 0x02, 0x03, 0x04, 0x05, 0x06, 0x07, 
		0x08, 0x09, 0x0a, 0x0b, 0x0c, 0x0d, 0x0e, 0x0f, 
		0x00, 0x01, 0x02, 0x03, 0x04, 0x05, 0x06, 0x07, 
		0x00, 0x01, 0x02, 0x03, 0x00, 0x01, 0x00, 0x00
	};
	const char *zIn = zSrc;
	const char *zEnd;
	const char *zCur;
	sxu8 *zOutPtr;
	sxu8 zOut[10];
	sxi32 c, d;
	sxi32 rc;
#if defined(UNTRUST)
	if( SX_EMPTY_STR(zSrc) || xConsumer == 0 ){
		return SXERR_EMPTY;
	}
#endif
	rc = SXRET_OK;
	zEnd = &zSrc[nLen];
	zCur = zIn;
	for(;;){
		while(zCur < zEnd && zCur[0] != '%' && zCur[0] != '+' ){
			zCur++;
		}
		if( zCur != zIn ){
			/* Consume input */
			rc = xConsumer(zIn, (unsigned int)(zCur-zIn), pUserData);
			if( rc != SXRET_OK ){
				/* User consumer routine request an operation abort */
				break;
			}
		}
		if( zCur >= zEnd ){
			rc = SXRET_OK;
			break;
		}
		/* Decode unsafe HTTP characters */
		zOutPtr = zOut;
		if( zCur[0] == '+' ){
			*zOutPtr++ = ' ';
			zCur++;
		}else{
			if( &zCur[2] >= zEnd ){
				rc = SXERR_OVERFLOW;
				break;
			}
			c = (SyAsciiToHex(zCur[1]) <<4) | SyAsciiToHex(zCur[2]);
			zCur += 3;
			if( c < 0x000C0 ){
				*zOutPtr++ = (sxu8)c;
			}else{
				c = Utf8Trans[c-0xC0];
				while( zCur[0] == '%' ){
					d = (SyAsciiToHex(zCur[1]) <<4) | SyAsciiToHex(zCur[2]);
					if( (d&0xC0) != 0x80 ){
						break;
					}
					c = (c<<6) + (0x3f & d);
					zCur += 3;
				}
				if( bUTF8 == FALSE ){
					*zOutPtr++ = (sxu8)c;
				}else{
					SX_WRITE_UTF8(zOutPtr, c);
				}
			}
			
		}
		/* Consume the decoded characters */
		rc = xConsumer((const void *)zOut, (unsigned int)(zOutPtr-zOut), pUserData);
		if( rc != SXRET_OK ){
			break;
		}
		/* Synchronize pointers */
		zIn = zCur;
	}
	return rc;
}